

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O3

int Sbd_ManCutReduceTop(Gia_Man_t *p,Vec_Int_t *vMirrors,int iObj,Vec_Int_t *vLutLevs,
                       Vec_Int_t *vCut,Vec_Int_t *vCutTop,int nCutSize)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  uint Entry;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  
  if ((iObj < 0) || (vLutLevs->nSize <= iObj)) {
LAB_005472bc:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar8 = vLutLevs->pArray[(uint)iObj];
  Vec_IntIsOrdered(vCut);
  if (0 < (long)vCutTop->nSize) {
    iVar8 = iVar8 + -2;
    uVar7 = (long)vCutTop->nSize + 1;
    do {
      iVar1 = vCutTop->pArray[uVar7 - 2];
      lVar5 = (long)iVar1;
      if ((lVar5 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar9 = (uint)*(undefined8 *)(p->pObjs + lVar5);
      if ((~uVar9 & 0x9fffffff) != 0) {
        if (((int)uVar9 < 0) || ((uVar9 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                        ,0x114,
                        "int Sbd_ManCutReduceTop(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        uVar6 = vLutLevs->nSize;
        if ((int)uVar6 <= iVar1) goto LAB_005472bc;
        piVar4 = vLutLevs->pArray;
        if (piVar4[lVar5] != iVar8) {
          __assert_fail("Vec_IntEntry(vLutLevs, Entry) == LevStop",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                        ,0x115,
                        "int Sbd_ManCutReduceTop(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        uVar9 = iVar1 - (uVar9 & 0x1fffffff);
        if (((((int)uVar9 < 0) || (vMirrors->nSize <= (int)uVar9)) ||
            (uVar10 = iVar1 - ((uint)((ulong)*(undefined8 *)(p->pObjs + lVar5) >> 0x20) & 0x1fffffff
                              ), (int)uVar10 < 0)) || ((uint)vMirrors->nSize <= uVar10))
        goto LAB_005472bc;
        uVar2 = vMirrors->pArray[uVar9];
        uVar3 = vMirrors->pArray[uVar10];
        Entry = uVar2 >> 1;
        if ((int)uVar2 < 0) {
          Entry = uVar9;
        }
        uVar9 = uVar3 >> 1;
        if ((int)uVar3 < 0) {
          uVar9 = uVar10;
        }
        if (uVar6 <= Entry) goto LAB_005472bc;
        if (piVar4[Entry] <= iVar8) {
          if (uVar6 <= uVar9) goto LAB_005472bc;
          if ((piVar4[uVar9] <= iVar8) && ((piVar4[Entry] != iVar8 || (piVar4[uVar9] != iVar8)))) {
            uVar6 = vCut->nSize;
            if (0 < (long)(int)uVar6) {
              piVar4 = vCut->pArray;
              lVar5 = 1;
              goto LAB_0054720b;
            }
            if (uVar6 != 0) {
              __assert_fail("i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
            }
            if (Entry == 0) goto LAB_0054727e;
            goto LAB_00547275;
          }
        }
      }
      uVar7 = uVar7 - 1;
    } while (1 < uVar7);
  }
  return 0;
LAB_0054720b:
  if (piVar4[lVar5 + -1] == iVar1) {
    if ((int)lVar5 < (int)uVar6) {
      do {
        piVar4[lVar5 + -1] = piVar4[lVar5];
        lVar5 = lVar5 + 1;
        uVar6 = vCut->nSize;
      } while ((int)lVar5 < (int)uVar6);
    }
    uVar6 = uVar6 - 1;
    vCut->nSize = uVar6;
LAB_00547258:
    if (Entry != 0) {
      if (0 < (int)uVar6) {
        uVar7 = 0;
        do {
          if (vCut->pArray[uVar7] == Entry) goto LAB_0054727e;
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
LAB_00547275:
      Vec_IntPushOrder(vCut,Entry);
    }
LAB_0054727e:
    if (uVar9 == 0) {
      return 1;
    }
    if (0 < (long)vCut->nSize) {
      lVar5 = 0;
      do {
        if (vCut->pArray[lVar5] == uVar9) {
          return 1;
        }
        lVar5 = lVar5 + 1;
      } while (vCut->nSize != lVar5);
    }
    Vec_IntPushOrder(vCut,uVar9);
    return 1;
  }
  bVar11 = lVar5 == (int)uVar6;
  lVar5 = lVar5 + 1;
  if (bVar11) goto LAB_00547258;
  goto LAB_0054720b;
}

Assistant:

int Sbd_ManCutReduceTop( Gia_Man_t * p, Vec_Int_t * vMirrors, int iObj, Vec_Int_t * vLutLevs, Vec_Int_t * vCut, Vec_Int_t * vCutTop, int nCutSize )
{
    int i, Entry, Lit0m, Lit1m, Fan0, Fan1;
    int LevStop = Vec_IntEntry(vLutLevs, iObj) - 2;
    Vec_IntIsOrdered( vCut );
    Vec_IntForEachEntryReverse( vCutTop, Entry, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, Entry );
        if ( Gia_ObjIsCi(pObj) )
            continue;
        assert( Gia_ObjIsAnd(pObj) );
        assert( Vec_IntEntry(vLutLevs, Entry) == LevStop );
        Lit0m = Vec_IntEntry( vMirrors, Gia_ObjFaninId0(pObj, Entry) );
        Lit1m = Vec_IntEntry( vMirrors, Gia_ObjFaninId1(pObj, Entry) );
        Fan0 = Lit0m >= 0 ? Abc_Lit2Var(Lit0m) : Gia_ObjFaninId0(pObj, Entry);
        Fan1 = Lit1m >= 0 ? Abc_Lit2Var(Lit1m) : Gia_ObjFaninId1(pObj, Entry);
        if ( Vec_IntEntry(vLutLevs, Fan0) > LevStop || Vec_IntEntry(vLutLevs, Fan1) > LevStop )
            continue;
        assert( Vec_IntEntry(vLutLevs, Fan0) <= LevStop );
        assert( Vec_IntEntry(vLutLevs, Fan1) <= LevStop );
        if ( Vec_IntEntry(vLutLevs, Fan0) == LevStop && Vec_IntEntry(vLutLevs, Fan1) == LevStop )
            continue;
        Vec_IntRemove( vCut, Entry );
        if ( Fan0 ) Vec_IntPushUniqueOrder( vCut, Fan0 );
        if ( Fan1 ) Vec_IntPushUniqueOrder( vCut, Fan1 );
        //Sbd_ManCutIsTopo( p, vMirrors, vCut, iObj );
        return 1;
    }
    return 0;
}